

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O3

Action __thiscall
psy::C::DeclarationBinder::visit_AtSpecifiers_COMMON<psy::C::VariableAndOrFunctionDeclarationSyntax>
          (DeclarationBinder *this,VariableAndOrFunctionDeclarationSyntax *node,
          offset_in_DeclarationBinder_to_subr visit_AtDeclarators)

{
  Action AVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *ty;
  undefined4 extraout_var_00;
  long in_RCX;
  long *plVar3;
  SpecifierListSyntax *pSVar4;
  SyntaxToken SStack_68;
  
  *(byte *)&this->field_7 = *(byte *)&this->field_7 & 0xf1;
  pSVar4 = node->specs_;
  while( true ) {
    if (pSVar4 == (SpecifierListSyntax *)0x0) {
      if ((this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        SyntaxNode::lastToken(&SStack_68,(SyntaxNode *)node);
        DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt(&this->diagReporter_,&SStack_68);
        SyntaxToken::~SyntaxToken(&SStack_68);
        ty = &makeType<psy::C::BasicType,psy::C::BasicTypeKind>(this,Int_S)->super_Type;
        pushType(this,ty);
      }
      pSVar4 = node->specs_;
      while( true ) {
        if (pSVar4 == (SpecifierListSyntax *)0x0) {
          plVar3 = (long *)((long)&(this->super_SyntaxVisitor)._vptr_SyntaxVisitor + in_RCX);
          if ((visit_AtDeclarators & 1) != 0) {
            visit_AtDeclarators = *(undefined8 *)(*plVar3 + -1 + visit_AtDeclarators);
          }
          AVar1 = (*(code *)visit_AtDeclarators)(plVar3,node);
          return AVar1;
        }
        iVar2 = (*(((pSVar4->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x3a])();
        if ((CONCAT44(extraout_var_00,iVar2) != 0) &&
           (AVar1 = SyntaxVisitor::visit
                              (&this->super_SyntaxVisitor,
                               &((pSVar4->
                                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                 ).
                                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                .value)->super_SyntaxNode), AVar1 == Quit)) break;
        pSVar4 = (pSVar4->
                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 ).
                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                 .next;
      }
      return Quit;
    }
    iVar2 = (*(((pSVar4->
                super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                ).
                super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x3a])();
    if ((CONCAT44(extraout_var,iVar2) == 0) &&
       (AVar1 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,
                           &((pSVar4->
                             super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                             ).
                             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                            .value)->super_SyntaxNode), AVar1 == Quit)) break;
    pSVar4 = (pSVar4->
             super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             ).
             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visit_AtSpecifiers_COMMON(
        const NodeT* node,
        Action (DeclarationBinder::*visit_AtDeclarators)(const NodeT*))
{
    F_.inImplicitIntTySpec_ = false;
    F_.inImplicitDoubleTySpec_ = false;
    F_.inExplicitSignedOrUnsignedTySpec_ = false;

    for (auto specIt = node->specifiers(); specIt; specIt = specIt->next) {
        if (!specIt->value->asTypeQualifier())
            VISIT(specIt->value);
    }

    if (tys_.empty()) {
        diagReporter_.TypeSpecifierMissingDefaultsToInt(node->lastToken());
        pushType(makeType<BasicType>(BasicTypeKind::Int_S));
    }

    for (auto specIt = node->specifiers(); specIt; specIt = specIt->next) {
        if (specIt->value->asTypeQualifier())
            VISIT(specIt->value);
    }

    return ((this)->*(visit_AtDeclarators))(node);
}